

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O1

UBool icu_63::anon_unknown_0::mungeCharName(char *dst,char *src,int32_t dstCapacity)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  
  uVar2 = 0;
LAB_002ec8c6:
  pcVar3 = src + 1;
  cVar1 = *src;
  src = pcVar3;
  if (cVar1 == ' ') goto code_r0x002ec8d2;
  if (cVar1 == '\0') {
    if (uVar2 != 0) {
      uVar2 = uVar2 - (dst[(uVar2 & 0xffffffff) - 1] == ' ');
    }
    dst[(int)uVar2] = '\0';
    return '\x01';
  }
  goto LAB_002ec8e4;
code_r0x002ec8d2:
  if ((uVar2 != 0) && (dst[uVar2 - 1] != ' ')) {
LAB_002ec8e4:
    if (uVar2 == 0x7f) {
      return '\0';
    }
    dst[uVar2] = cVar1;
    uVar2 = uVar2 + 1;
  }
  goto LAB_002ec8c6;
}

Assistant:

static UBool mungeCharName(char* dst, const char* src, int32_t dstCapacity) {
    /* Note: we use ' ' in compiler code page */
    int32_t j = 0;
    char ch;
    --dstCapacity; /* make room for term. zero */
    while ((ch = *src++) != 0) {
        if (ch == ' ' && (j==0 || (j>0 && dst[j-1]==' '))) {
            continue;
        }
        if (j >= dstCapacity) return FALSE;
        dst[j++] = ch;
    }
    if (j > 0 && dst[j-1] == ' ') --j;
    dst[j] = 0;
    return TRUE;
}